

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O2

_Bool Hacl_Ed25519_verify(uint8_t *public,uint8_t *msg,uint32_t len1,uint8_t *signature)

{
  uint64_t *puVar1;
  uint64_t *output;
  _Bool _Var2;
  uint8_t *rs;
  uint64_t tmp_1 [20];
  uint64_t r_ [5];
  undefined7 local_448;
  undefined1 uStack_441;
  undefined6 uStack_440;
  undefined1 local_43a;
  undefined6 uStack_439;
  undefined1 uStack_433;
  undefined6 uStack_432;
  undefined4 local_42c;
  uint64_t local_428 [40];
  uint64_t local_2e8 [20];
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  uint64_t local_218 [4];
  undefined8 local_1f8;
  uint64_t local_178 [5];
  uint64_t local_150 [5];
  uint64_t local_128 [10];
  uint64_t local_d8 [5];
  uint64_t local_b0 [5];
  uint64_t local_88 [11];
  
  memset(local_428 + 0x14,0,0x140);
  _Var2 = Hacl_Impl_Ed25519_PointDecompress_point_decompress(local_428 + 0x14,public);
  if (_Var2) {
    _Var2 = Hacl_Impl_Ed25519_PointDecompress_point_decompress(local_2e8,signature);
    if (_Var2) {
      local_248 = *(ulong *)(signature + 0x20) & 0xffffffffffffff;
      local_240 = *(ulong *)(signature + 0x27) & 0xffffffffffffff;
      local_238 = *(ulong *)(signature + 0x2e) & 0xffffffffffffff;
      local_230 = *(ulong *)(signature + 0x35) & 0xffffffffffffff;
      local_228 = (ulong)*(uint *)(signature + 0x3c);
      if ((local_228 < 0x10000001) &&
         ((*(uint *)(signature + 0x3c) != 0x10000000 ||
          ((local_238 < 0x14df && local_230 == 0 &&
           ((local_238 != 0x14de ||
            ((local_240 < 0xf9dea2f79cd659 &&
             (local_240 != 0xf9dea2f79cd658 || local_248 < 0x12631a5cf5d3ed)))))))))) {
        local_218[2] = 0;
        local_218[3] = 0;
        local_218[0] = 0;
        local_218[1] = 0;
        local_1f8 = 0;
        Hacl_Impl_SHA512_ModQ_sha512_modq_pre_pre2(local_218,signature,public,msg,len1);
        local_448 = (undefined7)local_218[0];
        uStack_441 = (undefined1)local_218[1];
        uStack_440 = (undefined6)(local_218[1] >> 8);
        local_43a = (undefined1)local_218[2];
        uStack_439 = (undefined6)(local_218[2] >> 8);
        uStack_433 = (undefined1)local_218[3];
        uStack_432 = (undefined6)(local_218[3] >> 8);
        local_42c = (undefined4)local_1f8;
        memset(local_218,0,0x1e0);
        local_428[0] = 0x62d608f25d51a;
        local_428[1] = 0x412a4b4f6592a;
        local_428[2] = 0x75b7171a4b31d;
        local_428[3] = 0x1ff60527118fe;
        local_428[4] = 0x216936d3cd6e5;
        local_428[5] = 0x6666666666658;
        local_428[6] = 0x4cccccccccccc;
        local_428[7] = 0x1999999999999;
        local_428[8] = 0x3333333333333;
        local_428[9] = 0x6666666666666;
        local_428[10] = 1;
        local_428[0xb] = 0;
        local_428[0xc] = 0;
        local_428[0xd] = 0;
        local_428[0xe] = 0;
        local_428[0xf] = 0x68ab3a5b7dda3;
        local_428[0x10] = 0xeea2a5eadbb;
        local_428[0x11] = 0x2af8df483c27e;
        local_428[0x12] = 0x332b375274732;
        local_428[0x13] = 0x67875f0fd78b7;
        Hacl_Impl_Ed25519_Ladder_point_mul(local_d8,signature + 0x20,local_428);
        Hacl_Impl_Ed25519_Ladder_point_mul(local_218,(uint8_t *)&local_448,local_428 + 0x14);
        Hacl_Impl_Ed25519_PointAdd_point_add(local_178,local_2e8,local_218);
        memset(local_428,0,0xa0);
        puVar1 = local_428 + 5;
        Hacl_Bignum_Fmul_fmul(local_428,local_d8,local_128);
        Hacl_Bignum25519_reduce(local_428);
        Hacl_Bignum_Fmul_fmul(puVar1,local_178,local_88);
        Hacl_Bignum25519_reduce(puVar1);
        _Var2 = Hacl_Impl_Ed25519_PointEqual_eq(local_428,puVar1);
        if (_Var2) {
          puVar1 = local_428 + 10;
          output = local_428 + 0xf;
          Hacl_Bignum_Fmul_fmul(puVar1,local_b0,local_128);
          Hacl_Bignum25519_reduce(puVar1);
          Hacl_Bignum_Fmul_fmul(output,local_150,local_88);
          Hacl_Bignum25519_reduce(output);
          _Var2 = Hacl_Impl_Ed25519_PointEqual_eq(puVar1,output);
          return _Var2;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool Hacl_Ed25519_verify(uint8_t *public, uint8_t *msg, uint32_t len1, uint8_t *signature)
{
  return Hacl_Impl_Ed25519_Verify_verify(public, msg, len1, signature);
}